

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::chacha20_testvector::test_method(chacha20_testvector *this)

{
  long in_FS_OFFSET;
  Nonce96 nonce;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "10f1e7e4d13b5915500fdd1fa32071c4c7d1f4c733c068030422aa9ac3d46c4ed2826446079faa0914c2d705d98b02a2b5129cd1de164eb9cbd083e8a2503c4e"
             ,&local_7b);
  nonce.second = 0x4a000000;
  nonce._0_8_ = 0x9000000;
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,nonce,1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "4c616469657320616e642047656e746c656d656e206f662074686520636c617373206f66202739393a204966204920636f756c64206f6666657220796f75206f6e6c79206f6e652074697020666f7220746865206675747572652c2073756e73637265656e20776f756c642062652069742e"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "6e2e359a2568f98041ba0728dd0d6981e97e7aec1d4360c20a27afccfd9fae0bf91b65c5524733ab8f593dabcd62b3571639d624e65152ab8f530c359f0861d807ca0dbf500d6a6156a38e088a22b65e52bc514d16ccf806818ce91ab77937365af90bbf74a35be6b40b8eedf2785e42874d"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x4a000000) << 0x40),1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),0,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "9f07e7be5551387a98ba977c732d080dcb0f29a048e3656912c6533e32ee7aed29b721769ce64e43d57133b074d839d531ed1f28510afb45ace10a1f4b794d6f"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),1,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000001",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "3aeb5224ecf849929b9d828db1ced4dd832025e8018b8160b82284f3c949aa5a8eca00bbb4a73bdad192b5c42f73f2fd4e273644c8b36125a64addeb006c13a0"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),1,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"00ff000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "72d54dfbf12ec44b362692df94137f328fea8da73990265ec1bbbea1ae9af0ca13b25aa26cb4a648cb9b9d1be65b2c0924a66c54d545ec1b7374f4872e99f096"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),2,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "c2c64d378cd536374ae204b9ef933fcd1a8b2288b3dfa49672ab765b54ee27c78a970e0e955c14f3a88e741b97c286f75f8fc299e8148362fa198a39531bed6d"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x200000000000000) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),0,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "416e79207375626d697373696f6e20746f20746865204945544620696e74656e6465642062792074686520436f6e7472696275746f7220666f72207075626c69636174696f6e20617320616c6c206f722070617274206f6620616e204945544620496e7465726e65742d4472616674206f722052464320616e6420616e792073746174656d656e74206d6164652077697468696e2074686520636f6e74657874206f6620616e204945544620616374697669747920697320636f6e7369646572656420616e20224945544620436f6e747269627574696f6e222e20537563682073746174656d656e747320696e636c756465206f72616c2073746174656d656e747320696e20494554462073657373696f6e732c2061732077656c6c206173207772697474656e20616e6420656c656374726f6e696320636f6d6d756e69636174696f6e73206d61646520617420616e792074696d65206f7220706c6163652c207768696368206172652061646472657373656420746f"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000001",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "a3fbf07df3fa2fde4f376ca23e82737041605d9f4f4f57bd8cff2c1d4b7955ec2a97948bd3722915c8f3d337f7d370050e9e96d647b7c39f56e031ca5eb6250d4042e02785ececfa4b4bb5e8ead0440e20b6e8db09d881a7c6132f420e52795042bdfa7773d8a9051447b3291ce1411c680465552aa6c405b7764d5e87bea85ad00f8449ed8f72d0d662ab052691ca66424bc86d2df80ea41f43abf937d3259dc4b2d0dfb48a6c9139ddd7f76966e928e635553ba76c5c879d7b35d49eb2e62b0871cdac638939e25e8a1e0ef9d5280fa8ca328b351c3c765989cbcf3daa8b6ccc3aaf9f3979c92b3720fc88dc95ed84a1be059c6499b9fda236e7e818b04b0bc39c1e876b193bfe5569753f88128cc08aaa9b63d1a16f80ef2554d7189c411f5869ca52c5b83fa36ff216b9c1d30062bebcfd2dc5bce0911934fda79a86f6e698ced759c3ff9b6477338f3da4f9cd8514ea9982ccafb341b2384dd902f3d1ab7ac61dd29c6f21ba5b862f3730e37cfdc4fd806c22f221"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x200000000000000) << 0x40),1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "2754776173206272696c6c69672c20616e642074686520736c6974687920746f7665730a446964206779726520616e642067696d626c6520696e2074686520776162653a0a416c6c206d696d737920776572652074686520626f726f676f7665732c0a416e6420746865206d6f6d65207261746873206f757467726162652e"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "62e6347f95ed87a45ffae7426f27a1df5fb69110044c0d73118effa95b01e5cf166d3df2d721caf9b21e5fb14c616871fd84c54f9d65b283196c7fe4f60553ebf39c6402c42234e32a356b3e764312a61a5532055716ead6962568f87d3f3f7704c6a8d1bcd1bf4d50d6154b6da731b187b58dfd728afa36757a797ac188d1"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x200000000000000) << 0x40),0x2a,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7",
             &local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),0,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000001",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ecfa254f845f647473d3cb140da9e87606cb33066c447b87bc2666dde3fbb739",
             &local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x200000000000000) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"965e3bc6f9ec7ed9560808f4d229f94b137ff275ca9b3fcbdd59deaad23310ae",
             &local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x200000000000000) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "4c616469657320616e642047656e746c656d656e206f662074686520636c617373206f66202739393a204966204920636f756c64206f6666657220796f75206f6e6c79206f6e652074697020666f7220746865206675747572652c2073756e73637265656e20776f756c642062652069742e"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "6e2e359a2568f98041ba0728dd0d6981e97e7aec1d4360c20a27afccfd9fae0bf91b65c5524733ab8f593dabcd62b3571639d624e65152ab8f530c359f0861d807ca0dbf500d6a6156a38e088a22b65e52bc514d16ccf806818ce91ab77937365af90bbf74a35be6b40b8eedf2785e42874d"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x4a000000) << 0x40),1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "224f51f3401bd9e12fde276fb8631ded8c131f823d2c06e27e4fcaec9ef3cf788a3b0aa372600a92b57974cded2b9334794cba40c63e34cdea212c4cf07d41b769a6749f3f630f4122cafe28ec4dc47e26d4346d70b98c73f3e9c53ac40c5945398b6eda1a832c89c167eacd901d7e2bf363"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x4a000000) << 0x40),1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),0,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000001",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "4540f05a9f1fb296d7736e7b208e3c96eb4fe1834688d2604f450952ed432d41bbe2a0b6ea7566d2a5d1e7e20d42af2c53d792b1c43fea817e9ad275ae546963"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,(Nonce96)ZEXT816(0),0,
             &local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "de9cba7bf3d69ef5e786dc63973f653a0b49e015adbff7134fcb7df137821031e85a050278a7084527214f73efc7fa5b5277062eb7a0433e445f41e3"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x100000000000000) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "ef3fdfd6c61578fbf5cf35bd3dd33b8009631634d21e42ac33960bd138e50d32111e4caf237ee53ca8ad6426194a88545ddc497a0b466e7d6bbdb0041b2f586b"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(1) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "f798a189f195e66982105ffb640bb7757f579da31602fc93ec01ac56f85ac3c134a4547b733b46413042c9440049176905d3be59ea1c53f15916155c2be8241a38008b9a26bc35941e2444177c8ade6689de95264986d95889fb60e84629c9bd9a5acb1cc118be563eb9b3a4a472f82e09a7e778492b562ef7130e88dfe031c79db9d4f7c7a899151b9a475032b63fc385245fe054e3dd5a97a5f576fe064025d3ce042c566ab2c507b138db853e3d6959660996546cc9c4a6eafdc777c040d70eaf46f76dad3979e5c5360c3317166a1c894c94a371876a94df7628fe4eaaf2ccb27d5aaae0ad7ad0f9d4b6ad3b54098746d4524d38407a6deb3ab78fab78c9"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0x706050403020100) << 0x40),0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "2d292c880513397b91221c3a647cfb0765a4815894715f411e3df5e0dd0ba9dffd565dea5addbdb914208fde7950f23e0385f9a727143f6a6ac51d84b1c0fb3e2e3b00b63d6841a1cc6d1538b1d3a74bef1eb2f54c7b7281e36e484dba89b351c8f572617e61e342879f211b0e4c515df50ea9d0771518fad96cd0baee62deb6"
             ,&local_7b);
  CryptoTest::TestChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,
             (Nonce96)(ZEXT816(0xdeadbeef12345678) << 0x40),0xffffffff,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"0000000000000000000000000000000000000000000000000000000000000000",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"a93df4ef03011f3db95f60d996e1785df5de38fc39bfcb663a47bb5561928349",
             &local_7b);
  CryptoTest::TestFSChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,0x100,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"01",&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ea",&local_7b);
  CryptoTest::TestFSChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,5,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"e93fdb5c762804b9a706816aca31e35b11d2aa3080108ef46a5b1f1508819c0a",
             &local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"8ec4c3ccdaea336bdeb245636970be01266509b33f3d2642504eaf412206207a",
             &local_7a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"8bfaa4eacff308fdb4a94a5ff25bd9d0c1f84b77f81239f67ff39d6e1ac280c9",
             &local_7b);
  CryptoTest::TestFSChaCha20
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_38,&local_58,0x1000,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(chacha20_testvector)
{
    /* Example from RFC8439 section 2.3.2. */
    TestChaCha20("",
                 "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                 {0x09000000, 0x4a000000}, 1,
                 "10f1e7e4d13b5915500fdd1fa32071c4c7d1f4c733c068030422aa9ac3d46c4e"
                 "d2826446079faa0914c2d705d98b02a2b5129cd1de164eb9cbd083e8a2503c4e");

    /* Example from RFC8439 section 2.4.2. */
    TestChaCha20("4c616469657320616e642047656e746c656d656e206f662074686520636c6173"
                 "73206f66202739393a204966204920636f756c64206f6666657220796f75206f"
                 "6e6c79206f6e652074697020666f7220746865206675747572652c2073756e73"
                 "637265656e20776f756c642062652069742e",
                 "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                 {0, 0x4a000000}, 1,
                 "6e2e359a2568f98041ba0728dd0d6981e97e7aec1d4360c20a27afccfd9fae0b"
                 "f91b65c5524733ab8f593dabcd62b3571639d624e65152ab8f530c359f0861d8"
                 "07ca0dbf500d6a6156a38e088a22b65e52bc514d16ccf806818ce91ab7793736"
                 "5af90bbf74a35be6b40b8eedf2785e42874d");

    // RFC 7539/8439 A.1 Test Vector #1:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 0,
                 "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7"
                 "da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586");

    // RFC 7539/8439 A.1 Test Vector #2:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 1,
                 "9f07e7be5551387a98ba977c732d080dcb0f29a048e3656912c6533e32ee7aed"
                 "29b721769ce64e43d57133b074d839d531ed1f28510afb45ace10a1f4b794d6f");

    // RFC 7539/8439 A.1 Test Vector #3:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000001",
                 {0, 0}, 1,
                 "3aeb5224ecf849929b9d828db1ced4dd832025e8018b8160b82284f3c949aa5a"
                 "8eca00bbb4a73bdad192b5c42f73f2fd4e273644c8b36125a64addeb006c13a0");

    // RFC 7539/8439 A.1 Test Vector #4:
    TestChaCha20("",
                 "00ff000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 2,
                 "72d54dfbf12ec44b362692df94137f328fea8da73990265ec1bbbea1ae9af0ca"
                 "13b25aa26cb4a648cb9b9d1be65b2c0924a66c54d545ec1b7374f4872e99f096");

    // RFC 7539/8439 A.1 Test Vector #5:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0x200000000000000}, 0,
                 "c2c64d378cd536374ae204b9ef933fcd1a8b2288b3dfa49672ab765b54ee27c7"
                 "8a970e0e955c14f3a88e741b97c286f75f8fc299e8148362fa198a39531bed6d");

    // RFC 7539/8439 A.2 Test Vector #1:
    TestChaCha20("0000000000000000000000000000000000000000000000000000000000000000"
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 0,
                 "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7"
                 "da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586");

    // RFC 7539/8439 A.2 Test Vector #2:
    TestChaCha20("416e79207375626d697373696f6e20746f20746865204945544620696e74656e"
                 "6465642062792074686520436f6e7472696275746f7220666f72207075626c69"
                 "636174696f6e20617320616c6c206f722070617274206f6620616e2049455446"
                 "20496e7465726e65742d4472616674206f722052464320616e6420616e792073"
                 "746174656d656e74206d6164652077697468696e2074686520636f6e74657874"
                 "206f6620616e204945544620616374697669747920697320636f6e7369646572"
                 "656420616e20224945544620436f6e747269627574696f6e222e205375636820"
                 "73746174656d656e747320696e636c756465206f72616c2073746174656d656e"
                 "747320696e20494554462073657373696f6e732c2061732077656c6c20617320"
                 "7772697474656e20616e6420656c656374726f6e696320636f6d6d756e696361"
                 "74696f6e73206d61646520617420616e792074696d65206f7220706c6163652c"
                 "207768696368206172652061646472657373656420746f",
                 "0000000000000000000000000000000000000000000000000000000000000001",
                 {0, 0x200000000000000}, 1,
                 "a3fbf07df3fa2fde4f376ca23e82737041605d9f4f4f57bd8cff2c1d4b7955ec"
                 "2a97948bd3722915c8f3d337f7d370050e9e96d647b7c39f56e031ca5eb6250d"
                 "4042e02785ececfa4b4bb5e8ead0440e20b6e8db09d881a7c6132f420e527950"
                 "42bdfa7773d8a9051447b3291ce1411c680465552aa6c405b7764d5e87bea85a"
                 "d00f8449ed8f72d0d662ab052691ca66424bc86d2df80ea41f43abf937d3259d"
                 "c4b2d0dfb48a6c9139ddd7f76966e928e635553ba76c5c879d7b35d49eb2e62b"
                 "0871cdac638939e25e8a1e0ef9d5280fa8ca328b351c3c765989cbcf3daa8b6c"
                 "cc3aaf9f3979c92b3720fc88dc95ed84a1be059c6499b9fda236e7e818b04b0b"
                 "c39c1e876b193bfe5569753f88128cc08aaa9b63d1a16f80ef2554d7189c411f"
                 "5869ca52c5b83fa36ff216b9c1d30062bebcfd2dc5bce0911934fda79a86f6e6"
                 "98ced759c3ff9b6477338f3da4f9cd8514ea9982ccafb341b2384dd902f3d1ab"
                 "7ac61dd29c6f21ba5b862f3730e37cfdc4fd806c22f221");

    // RFC 7539/8439 A.2 Test Vector #3:
    TestChaCha20("2754776173206272696c6c69672c20616e642074686520736c6974687920746f"
                 "7665730a446964206779726520616e642067696d626c6520696e207468652077"
                 "6162653a0a416c6c206d696d737920776572652074686520626f726f676f7665"
                 "732c0a416e6420746865206d6f6d65207261746873206f757467726162652e",
                 "1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
                 {0, 0x200000000000000}, 42,
                 "62e6347f95ed87a45ffae7426f27a1df5fb69110044c0d73118effa95b01e5cf"
                 "166d3df2d721caf9b21e5fb14c616871fd84c54f9d65b283196c7fe4f60553eb"
                 "f39c6402c42234e32a356b3e764312a61a5532055716ead6962568f87d3f3f77"
                 "04c6a8d1bcd1bf4d50d6154b6da731b187b58dfd728afa36757a797ac188d1");

    // RFC 7539/8439 A.4 Test Vector #1:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 0,
                 "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7");

    // RFC 7539/8439 A.4 Test Vector #2:
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000001",
                 {0, 0x200000000000000}, 0,
                 "ecfa254f845f647473d3cb140da9e87606cb33066c447b87bc2666dde3fbb739");

    // RFC 7539/8439 A.4 Test Vector #3:
    TestChaCha20("",
                 "1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
                 {0, 0x200000000000000}, 0,
                 "965e3bc6f9ec7ed9560808f4d229f94b137ff275ca9b3fcbdd59deaad23310ae");

    // test encryption
    TestChaCha20("4c616469657320616e642047656e746c656d656e206f662074686520636c617373206f66202739393a204966204920636f756"
                 "c64206f6666657220796f75206f6e6c79206f6e652074697020666f7220746865206675747572652c2073756e73637265656e"
                 "20776f756c642062652069742e",
                 "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f", {0, 0x4a000000UL}, 1,
                 "6e2e359a2568f98041ba0728dd0d6981e97e7aec1d4360c20a27afccfd9fae0bf91b65c5524733ab8f593dabcd62b3571639d"
                 "624e65152ab8f530c359f0861d807ca0dbf500d6a6156a38e088a22b65e52bc514d16ccf806818ce91ab77937365af90bbf74"
                 "a35be6b40b8eedf2785e42874d"
                 );

    // test keystream output
    TestChaCha20("", "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f", {0, 0x4a000000UL}, 1,
                 "224f51f3401bd9e12fde276fb8631ded8c131f823d2c06e27e4fcaec9ef3cf788a3b0aa372600a92b57974cded2b9334794cb"
                 "a40c63e34cdea212c4cf07d41b769a6749f3f630f4122cafe28ec4dc47e26d4346d70b98c73f3e9c53ac40c5945398b6eda1a"
                 "832c89c167eacd901d7e2bf363");

    // Test vectors from https://tools.ietf.org/html/draft-agl-tls-chacha20poly1305-04#section-7
    // The first one is identical to the above one from the RFC8439 A.1 vectors, but repeated here
    // for completeness.
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0}, 0,
                 "76b8e0ada0f13d90405d6ae55386bd28bdd219b8a08ded1aa836efcc8b770dc7"
                 "da41597c5157488d7724e03fb8d84a376a43b8f41518a11cc387b669b2ee6586");
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000001",
                 {0, 0}, 0,
                 "4540f05a9f1fb296d7736e7b208e3c96eb4fe1834688d2604f450952ed432d41"
                 "bbe2a0b6ea7566d2a5d1e7e20d42af2c53d792b1c43fea817e9ad275ae546963");
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 0x0100000000000000ULL}, 0,
                 "de9cba7bf3d69ef5e786dc63973f653a0b49e015adbff7134fcb7df137821031"
                 "e85a050278a7084527214f73efc7fa5b5277062eb7a0433e445f41e3");
    TestChaCha20("",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 {0, 1}, 0,
                 "ef3fdfd6c61578fbf5cf35bd3dd33b8009631634d21e42ac33960bd138e50d32"
                 "111e4caf237ee53ca8ad6426194a88545ddc497a0b466e7d6bbdb0041b2f586b");
    TestChaCha20("",
                 "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                 {0, 0x0706050403020100ULL}, 0,
                 "f798a189f195e66982105ffb640bb7757f579da31602fc93ec01ac56f85ac3c1"
                 "34a4547b733b46413042c9440049176905d3be59ea1c53f15916155c2be8241a"
                 "38008b9a26bc35941e2444177c8ade6689de95264986d95889fb60e84629c9bd"
                 "9a5acb1cc118be563eb9b3a4a472f82e09a7e778492b562ef7130e88dfe031c7"
                 "9db9d4f7c7a899151b9a475032b63fc385245fe054e3dd5a97a5f576fe064025"
                 "d3ce042c566ab2c507b138db853e3d6959660996546cc9c4a6eafdc777c040d7"
                 "0eaf46f76dad3979e5c5360c3317166a1c894c94a371876a94df7628fe4eaaf2"
                 "ccb27d5aaae0ad7ad0f9d4b6ad3b54098746d4524d38407a6deb3ab78fab78c9");

    // Test overflow of 32-bit block counter, should increment the first 32-bit
    // part of the nonce to retain compatibility with >256 GiB output.
    // The test data was generated with an implementation that uses a 64-bit
    // counter and a 64-bit initialization vector (PyCryptodome's ChaCha20 class
    // with 8 bytes nonce length).
    TestChaCha20("",
                 "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                 {0, 0xdeadbeef12345678}, 0xffffffff,
                 "2d292c880513397b91221c3a647cfb0765a4815894715f411e3df5e0dd0ba9df"
                 "fd565dea5addbdb914208fde7950f23e0385f9a727143f6a6ac51d84b1c0fb3e"
                 "2e3b00b63d6841a1cc6d1538b1d3a74bef1eb2f54c7b7281e36e484dba89b351"
                 "c8f572617e61e342879f211b0e4c515df50ea9d0771518fad96cd0baee62deb6");

    // Forward secure ChaCha20
    TestFSChaCha20("000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                   "0000000000000000000000000000000000000000000000000000000000000000",
                   256,
                   "a93df4ef03011f3db95f60d996e1785df5de38fc39bfcb663a47bb5561928349");
    TestFSChaCha20("01",
                   "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
                   5,
                   "ea");
    TestFSChaCha20("e93fdb5c762804b9a706816aca31e35b11d2aa3080108ef46a5b1f1508819c0a",
                   "8ec4c3ccdaea336bdeb245636970be01266509b33f3d2642504eaf412206207a",
                   4096,
                   "8bfaa4eacff308fdb4a94a5ff25bd9d0c1f84b77f81239f67ff39d6e1ac280c9");
}